

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  BYTE *pBVar1;
  undefined8 *puVar2;
  BYTE *pBVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  U32 UVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  U32 UVar12;
  size_t sVar13;
  size_t sVar14;
  U32 UVar15;
  int *piVar16;
  int *ip_00;
  ulong uVar17;
  seqDef *psVar18;
  uint local_ac;
  int *local_a8;
  size_t offsetFound;
  size_t local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  seqStore_t *local_78;
  long local_70;
  ZSTD_matchState_t *local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  U32 local_54;
  int *local_50;
  int *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  piVar16 = (int *)((long)src + srcSize);
  local_40 = (ms->window).base + (ms->window).dictLimit;
  local_58 = rep[1];
  ip_00 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  local_5c = (int)ip_00 - (int)local_40;
  local_ac = local_58;
  if (local_5c < local_58) {
    local_ac = 0;
  }
  local_80 = (int *)((long)src + (srcSize - 8));
  local_60 = *rep;
  uVar17 = (ulong)local_60;
  if (local_5c < local_60) {
    uVar17 = 0;
  }
  local_48 = (int *)((long)src + (srcSize - 0x20));
  local_78 = seqStore;
  local_68 = ms;
  local_38 = rep;
  do {
    UVar12 = (U32)uVar17;
    local_70 = -uVar17;
    while( true ) {
      if (local_80 <= ip_00) {
        UVar6 = 0;
        if (local_5c < local_58) {
          UVar6 = local_58;
        }
        if (local_5c < local_60) {
          UVar6 = local_60;
        }
        if (UVar12 == 0) {
          UVar12 = UVar6;
        }
        if (local_ac != 0) {
          UVar6 = local_ac;
        }
        *local_38 = UVar12;
        local_38[1] = UVar6;
        return (long)piVar16 - (long)src;
      }
      if (UVar12 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        if (*(int *)((long)ip_00 + local_70 + 1) == *(int *)((long)ip_00 + 1)) {
          sVar7 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + local_70 + 5),
                             (BYTE *)piVar16);
          uVar10 = sVar7 + 4;
        }
      }
      offsetFound = 999999999;
      sVar7 = ZSTD_BtFindBestMatch_selectMLS(local_68,(BYTE *)ip_00,(BYTE *)piVar16,&offsetFound);
      uVar9 = uVar10;
      if (uVar10 < sVar7) {
        uVar9 = sVar7;
      }
      if (3 < uVar9) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    sVar13 = offsetFound;
    if (sVar7 <= uVar10) {
      sVar13 = 0;
    }
    ip = (int *)((long)ip_00 + 1);
    local_90 = piVar16;
    local_50 = (int *)src;
    if (uVar10 < sVar7) {
      ip = ip_00;
    }
    while (local_a8 = ip, piVar16 = local_90, sVar7 = sVar13, sVar14 = uVar9, ip_00 < local_80) {
      local_88 = (int *)((long)ip_00 + 1);
      if (sVar13 == 0) {
        sVar7 = 0;
      }
      else if ((UVar12 != 0) && (*local_88 == *(int *)((long)local_88 + local_70))) {
        sVar8 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + local_70 + 5),
                           (BYTE *)local_90);
        UVar6 = ZSTD_highbit32((int)sVar13 + 1);
        if ((sVar8 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar9 * 3 - UVar6) + 1) < (int)(sVar8 + 4) * 3)) {
          local_a8 = local_88;
          sVar14 = sVar8 + 4;
          sVar7 = 0;
        }
      }
      offsetFound = 999999999;
      uVar9 = ZSTD_BtFindBestMatch_selectMLS(local_68,(BYTE *)local_88,(BYTE *)piVar16,&offsetFound)
      ;
      sVar13 = offsetFound;
      local_54 = ZSTD_highbit32((int)offsetFound + 1);
      UVar15 = (int)sVar7 + 1;
      local_98 = sVar7;
      UVar6 = ZSTD_highbit32(UVar15);
      if ((uVar9 < 4) || ((int)((int)uVar9 * 4 - local_54) <= (int)(((int)sVar14 * 4 - UVar6) + 4)))
      {
        sVar7 = local_98;
        if (local_80 <= local_88) break;
        ip = (int *)((long)ip_00 + 2);
        if (local_98 == 0) {
          sVar7 = 0;
        }
        else if ((UVar12 != 0) && (*ip == *(int *)((long)ip + local_70))) {
          sVar13 = ZSTD_count((BYTE *)((long)ip_00 + 6),(BYTE *)((long)ip_00 + local_70 + 6),
                              (BYTE *)local_90);
          UVar6 = ZSTD_highbit32(UVar15);
          sVar7 = local_98;
          if ((sVar13 < 0xfffffffffffffffc) &&
             ((int)(((int)sVar14 * 4 + 1) - UVar6) < (int)(sVar13 + 4) * 4)) {
            sVar14 = sVar13 + 4;
            sVar7 = 0;
            local_a8 = ip;
          }
        }
        offsetFound = 999999999;
        uVar9 = ZSTD_BtFindBestMatch_selectMLS(local_68,(BYTE *)ip,(BYTE *)local_90,&offsetFound);
        sVar13 = offsetFound;
        UVar6 = ZSTD_highbit32((int)offsetFound + 1);
        UVar15 = ZSTD_highbit32((int)sVar7 + 1);
        src = local_50;
        if ((uVar9 < 4) ||
           (ip_00 = ip, (int)((int)uVar9 * 4 - UVar6) <= (int)(((int)sVar14 * 4 - UVar15) + 7)))
        break;
      }
      else {
        local_a8 = local_88;
        ip_00 = local_88;
        ip = local_a8;
      }
    }
    piVar16 = local_90;
    if (sVar7 == 0) {
      UVar12 = 1;
      uVar10 = (ulong)local_ac;
    }
    else {
      for (; ((src < local_a8 && (local_40 < (BYTE *)((long)local_a8 + (2 - sVar7)))) &&
             (*(BYTE *)((long)local_a8 + -1) == *(BYTE *)((long)local_a8 + (1 - sVar7))));
          local_a8 = (int *)((long)local_a8 + -1)) {
        sVar14 = sVar14 + 1;
      }
      UVar12 = (int)sVar7 + 1;
      uVar10 = uVar17;
      uVar17 = (ulong)((int)sVar7 - 2);
    }
    if (local_78->maxNbSeq <=
        (ulong)((long)local_78->sequences - (long)local_78->sequencesStart >> 3)) {
LAB_00117565:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_78->maxNbLit) {
LAB_001175c2:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar9 = (long)local_a8 - (long)src;
    pBVar3 = local_78->lit;
    if (local_78->litStart + local_78->maxNbLit < pBVar3 + uVar9) {
LAB_00117584:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_90 < local_a8) {
LAB_001175a3:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_48 < local_a8) {
      ZSTD_safecopyLiterals(pBVar3,(BYTE *)src,(BYTE *)local_a8,(BYTE *)local_48);
LAB_001172dc:
      local_78->lit = local_78->lit + uVar9;
      if (0xffff < uVar9) {
        if (local_78->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_78->longLengthID = 1;
        local_78->longLengthPos =
             (U32)((ulong)((long)local_78->sequences - (long)local_78->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar3 = *src;
      *(undefined8 *)(pBVar3 + 8) = uVar4;
      pBVar3 = local_78->lit;
      if (0x10 < uVar9) {
        lVar11 = (long)(pBVar3 + 0x10) - ((long)src + 0x10);
        if (lVar11 < 8) {
          if (-0x10 < lVar11) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar11 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar4 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar3 + 0x18) = uVar4;
        if (0x20 < (long)uVar9) {
          lVar11 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar11 + 0x20);
            uVar4 = puVar2[1];
            pBVar1 = pBVar3 + lVar11 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar4;
            puVar2 = (undefined8 *)((long)src + lVar11 + 0x30);
            uVar4 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar4;
            lVar11 = lVar11 + 0x20;
          } while (pBVar1 + 0x20 < pBVar3 + uVar9);
        }
        goto LAB_001172dc;
      }
      local_78->lit = pBVar3 + uVar9;
    }
    psVar5 = local_78;
    psVar18 = local_78->sequences;
    psVar18->litLength = (U16)uVar9;
    psVar18->offset = UVar12;
    if (0xffff < sVar14 - 3) {
      if (local_78->longLengthID != 0) {
LAB_001175e1:
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_78->longLengthID = 2;
      local_78->longLengthPos = (U32)((ulong)((long)psVar18 - (long)local_78->sequencesStart) >> 3);
    }
    psVar18->matchLength = (U16)(sVar14 - 3);
    psVar18 = psVar18 + 1;
    local_78->sequences = psVar18;
    uVar9 = uVar17;
    for (src = (void *)((long)local_a8 + sVar14);
        ((uVar17 = uVar9, local_ac = (uint)uVar10, ip_00 = (int *)src, local_ac != 0 &&
         (src <= local_80)) && (*src == *(int *)((long)src - uVar10)));
        src = (void *)((long)src + sVar7 + 4)) {
      sVar7 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - uVar10)),(BYTE *)piVar16)
      ;
      if (psVar5->maxNbSeq <= (ulong)((long)psVar18 - (long)psVar5->sequencesStart >> 3))
      goto LAB_00117565;
      if (0x20000 < psVar5->maxNbLit) goto LAB_001175c2;
      pBVar3 = psVar5->lit;
      if (psVar5->litStart + psVar5->maxNbLit < pBVar3) goto LAB_00117584;
      if (piVar16 < src) goto LAB_001175a3;
      if (local_48 < src) {
        ZSTD_safecopyLiterals(pBVar3,(BYTE *)src,(BYTE *)src,(BYTE *)local_48);
      }
      else {
        uVar4 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar3 = *src;
        *(undefined8 *)(pBVar3 + 8) = uVar4;
      }
      psVar18 = psVar5->sequences;
      psVar18->litLength = 0;
      psVar18->offset = 1;
      if (0xffff < sVar7 + 1) {
        if (psVar5->longLengthID != 0) goto LAB_001175e1;
        psVar5->longLengthID = 2;
        psVar5->longLengthPos = (U32)((ulong)((long)psVar18 - (long)psVar5->sequencesStart) >> 3);
      }
      psVar18->matchLength = (U16)(sVar7 + 1);
      psVar18 = psVar18 + 1;
      psVar5->sequences = psVar18;
      uVar9 = uVar10;
      uVar10 = uVar17;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_noDict);
}